

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O1

int is_forced_keyframe_pending
              (lookahead_ctx *lookahead,int up_to_index,COMPRESSOR_STAGE compressor_stage)

{
  lookahead_entry *plVar1;
  int unaff_EBP;
  int index;
  bool bVar2;
  
  if (-1 < up_to_index) {
    index = 0;
    do {
      plVar1 = av1_lookahead_peek(lookahead,index,compressor_stage);
      if (plVar1 == (lookahead_entry *)0x0) {
        bVar2 = false;
        unaff_EBP = -1;
      }
      else {
        bVar2 = plVar1->flags != 1;
        if (!bVar2) {
          unaff_EBP = index;
        }
      }
      if (!bVar2) {
        return unaff_EBP;
      }
      index = index + 1;
    } while (up_to_index + 1 != index);
  }
  return -1;
}

Assistant:

int is_forced_keyframe_pending(struct lookahead_ctx *lookahead,
                               const int up_to_index,
                               const COMPRESSOR_STAGE compressor_stage) {
  for (int i = 0; i <= up_to_index; i++) {
    const struct lookahead_entry *e =
        av1_lookahead_peek(lookahead, i, compressor_stage);
    if (e == NULL) {
      // We have reached the end of the lookahead buffer and not early-returned
      // so there isn't a forced key-frame pending.
      return -1;
    } else if (e->flags == AOM_EFLAG_FORCE_KF) {
      return i;
    } else {
      continue;
    }
  }
  return -1;  // Never reached
}